

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O0

int value_from_picture_or_in_proc(Am_Object *self)

{
  byte bVar1;
  Am_Value *pAVar2;
  Am_Object local_40;
  undefined4 local_38;
  undefined1 local_28 [8];
  Am_Value v;
  Am_Object *self_local;
  
  v.value = (anon_union_8_8_ea4c8939_for_value)self;
  Am_Value::Am_Value((Am_Value *)local_28);
  pAVar2 = Am_Object::Peek((Am_Object *)v.value.wrapper_value,INPUT_1,0);
  Am_Value::operator=((Am_Value *)local_28,(Am_Value *)pAVar2);
  bVar1 = Am_Value::Valid();
  if ((bVar1 & 1) == 0) {
    Am_Object::Get_Object((ushort)&local_40,v.value.long_value);
    pAVar2 = Am_Object::Peek(&local_40,0x169,0);
    Am_Value::operator=((Am_Value *)local_28,(Am_Value *)pAVar2);
    Am_Object::~Am_Object(&local_40);
    bVar1 = Am_Value::Valid();
    self_local._4_4_ = (uint)(bVar1 & 1);
  }
  else {
    self_local._4_4_ = get_value_end_of((Am_Object *)v.value.wrapper_value,INPUT_1);
  }
  local_38 = 1;
  Am_Value::~Am_Value((Am_Value *)local_28);
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, value_from_picture_or_in) {
  Am_Value v;
  v = self.Peek(INPUT_1); //check if in wire; if so, return its value
  if (v.Valid()) return get_value_end_of(self, INPUT_1);
  else {
    v = self.Get_Object(PICTURE).Peek(Am_VALUE);
    return (v.Valid());
  }
}